

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_format.hpp
# Opt level: O0

void lightconf::config_format::write_group(scanner *sc,writer *wr,bool braces,group *gr)

{
  group *pgVar1;
  writer *pwVar2;
  writer *sc_00;
  bool bVar3;
  int iVar4;
  reference path_string;
  return_type<lightconf::value> pvVar5;
  size_type sVar6;
  bool local_551;
  bool local_529;
  bool local_4d2;
  byte local_4d1;
  bool local_4aa;
  allocator local_4a9;
  string local_4a8;
  allocator local_481;
  string local_480;
  allocator local_459;
  string local_458;
  path local_438;
  allocator local_419;
  string local_418;
  undefined1 local_3f8 [8];
  scanner dummy_scanner;
  string local_378;
  reference local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  int local_330;
  uint i;
  token local_328;
  value local_2e8;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  token local_200;
  undefined1 local_1b9;
  iterator iStack_1b8;
  bool terminate;
  const_iterator local_1b0;
  path local_1a8;
  allocator local_189;
  string local_188;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  key_it;
  string key_1;
  token local_120;
  token local_e0;
  reference local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  const_iterator __end2;
  const_iterator __begin2;
  group *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  allocator local_51;
  string local_50;
  bool local_29;
  group *pgStack_28;
  bool wrap;
  group *gr_local;
  writer *pwStack_18;
  bool braces_local;
  writer *wr_local;
  scanner *sc_local;
  
  local_4aa = true;
  pgStack_28 = gr;
  gr_local._7_1_ = braces;
  pwStack_18 = wr;
  wr_local = (writer *)sc;
  if (braces) {
    iVar4 = group_length(gr,0x78);
    local_4aa = pwStack_18->wrap_length < iVar4;
  }
  pwVar2 = pwStack_18;
  local_29 = local_4aa;
  if ((gr_local._7_1_ & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"{ ",&local_51);
    writer::append(pwVar2,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    writer::indent(pwStack_18);
    if ((local_29 & 1U) != 0) {
      writer::newline(pwStack_18);
    }
    scanner::expect((scanner *)wr_local,'{',false);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range2);
  pgVar1 = pgStack_28;
  __end2 = group::begin_abi_cxx11_(pgStack_28);
  key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        group::end_abi_cxx11_(pgVar1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&key), bVar3) {
    local_a0 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2,local_a0);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  do {
    bVar3 = false;
    scanner::peek_token(&local_e0,(scanner *)wr_local);
    local_4d1 = 0;
    if (local_e0.type != eof_token) {
      bVar3 = (gr_local._7_1_ & 1) != 0;
      local_4d2 = false;
      if (bVar3) {
        scanner::peek_token(&local_120,(scanner *)wr_local);
        local_4d2 = token::is_char(&local_120,'}');
      }
      local_4d1 = local_4d2 ^ 0xff;
    }
    if (bVar3) {
      token::~token(&local_120);
    }
    token::~token(&local_e0);
    if ((local_4d1 & 1) == 0) break;
    scanner::expect_identifier_abi_cxx11_((string *)&key_it,(scanner *)wr_local);
    scanner::expect((scanner *)wr_local,'=',false);
    local_158._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2);
    local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range2);
    local_150 = std::
                find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                          (local_158,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_160,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &key_it);
    local_168._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2);
    bVar3 = __gnu_cxx::operator!=(&local_150,&local_168);
    if (bVar3) {
      writer::append(pwStack_18,(string *)&key_it);
      pwVar2 = pwStack_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_188," = ",&local_189);
      writer::append(pwVar2,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
      sc_00 = wr_local;
      pwVar2 = pwStack_18;
      pgVar1 = pgStack_28;
      path_string = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_150);
      path::path(&local_1a8,path_string,'.');
      pvVar5 = group::get<lightconf::value>(pgVar1,&local_1a8);
      write_value((scanner *)sc_00,pwVar2,pvVar5);
      path::~path(&local_1a8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_1b0,&local_150);
      iStack_1b8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range2,local_1b0);
      scanner::peek_token(&local_200,(scanner *)wr_local);
      bVar3 = token::is_char(&local_200,'}');
      local_529 = false;
      if (bVar3) {
        local_529 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&__range2);
      }
      token::~token(&local_200);
      pwVar2 = pwStack_18;
      local_1b9 = local_529;
      if (local_529 == false) {
        if ((local_29 & 1U) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_220,", ",&local_221);
          writer::append(pwVar2,&local_220);
          std::__cxx11::string::~string((string *)&local_220);
          std::allocator<char>::~allocator((allocator<char> *)&local_221);
        }
        else {
          writer::newline(pwStack_18);
        }
      }
      else if ((local_29 & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_248," ",&local_249);
        writer::append(pwVar2,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator((allocator<char> *)&local_249);
      }
    }
    else {
      read_value(&local_2e8,(scanner *)wr_local);
      value::~value(&local_2e8);
    }
    scanner::expect((scanner *)wr_local,',',true);
    local_551 = false;
    if ((gr_local._7_1_ & 1) != 0) {
      scanner::peek_token(&local_328,(scanner *)wr_local);
      local_551 = token::is_char(&local_328,'}');
      token::~token(&local_328);
    }
    if (local_551 == false) {
      local_330 = 0;
    }
    else {
      local_330 = 5;
    }
    std::__cxx11::string::~string((string *)&key_it);
  } while (local_330 == 0);
  __range2_1._4_4_ = 0;
  __end2_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
  key_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&key_2), bVar3) {
    local_358 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2_1);
    writer::append(pwStack_18,local_358);
    pwVar2 = pwStack_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_378," = ",(allocator *)&dummy_scanner.params_.field_0x27);
    writer::append(pwVar2,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator((allocator<char> *)&dummy_scanner.params_.field_0x27);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_418,"0",&local_419);
    make_scanner((scanner *)local_3f8,&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator((allocator<char> *)&local_419);
    pwVar2 = pwStack_18;
    pgVar1 = pgStack_28;
    path::path(&local_438,local_358,'.');
    pvVar5 = group::get<lightconf::value>(pgVar1,&local_438);
    write_value((scanner *)local_3f8,pwVar2,pvVar5);
    path::~path(&local_438);
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2);
    pwVar2 = pwStack_18;
    if ((ulong)__range2_1._4_4_ < sVar6 - 1) {
      if ((local_29 & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_458,", ",&local_459);
        writer::append(pwVar2,&local_458);
        std::__cxx11::string::~string((string *)&local_458);
        std::allocator<char>::~allocator((allocator<char> *)&local_459);
      }
      else {
        writer::newline(pwStack_18);
      }
    }
    else if ((local_29 & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_480," ",&local_481);
      writer::append(pwVar2,&local_480);
      std::__cxx11::string::~string((string *)&local_480);
      std::allocator<char>::~allocator((allocator<char> *)&local_481);
    }
    __range2_1._4_4_ = __range2_1._4_4_ + 1;
    scanner::~scanner((scanner *)local_3f8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2_1);
  }
  if ((gr_local._7_1_ & 1) != 0) {
    writer::unindent(pwStack_18);
    if ((local_29 & 1U) != 0) {
      writer::newline(pwStack_18);
    }
    scanner::expect((scanner *)wr_local,'}',false);
    pwVar2 = pwStack_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4a8,"}",&local_4a9);
    writer::append(pwVar2,&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range2);
  return;
}

Assistant:

inline void write_group(scanner& sc, writer& wr, bool braces, const group& gr) {
    bool wrap = !braces || group_length(gr) > wr.wrap_length;

    if (braces) {
        wr.append("{ ");
        wr.indent();
        if (wrap) {
            wr.newline();
        }
        sc.expect('{');
    }

    std::vector<std::string> keys;
    for (const auto& key : gr) {
        keys.push_back(key);
    }

    while (sc.peek_token().type != token_type::eof_token && !(braces && sc.peek_token().is_char('}'))) {
        std::string key = sc.expect_identifier();
        sc.expect('=');

        auto key_it = std::find(std::begin(keys), std::end(keys), key);
        if (key_it != keys.end()) {
            wr.append(key);
            wr.append(" = ");
            write_value(sc, wr, gr.get<value>(*key_it));
            keys.erase(key_it);
            bool terminate = sc.peek_token().is_char('}') && keys.empty();
            if (!terminate) {
                if (wrap) {
                    wr.newline();
                } else {
                    wr.append(", ");
                }
            } else if (!wrap) {
                wr.append(" ");
            }
        } else {
            read_value(sc);
        }

        sc.expect(',', true);
        if (braces && sc.peek_token().is_char('}')) {
            break;
        }
    }

    unsigned int i = 0;
    for (const auto& key : keys) {
        wr.append(key);
        wr.append(" = ");
        scanner dummy_scanner = make_scanner("0");
        write_value(dummy_scanner, wr, gr.get<value>(key));
        if (i < keys.size() - 1) {
            if (wrap) {
                wr.newline();
            } else {
                wr.append(", ");
            }
        } else if (!wrap) {
            wr.append(" ");
        }
        i++;
    }

    if (braces) {
        wr.unindent();
        if (wrap) {
            wr.newline();
        }
        sc.expect('}');
        wr.append("}");
    }
}